

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O2

spv_diagnostic spvDiagnosticCreate(spv_position position,char *message)

{
  size_t sVar1;
  spv_diagnostic psVar2;
  size_t sVar3;
  char *__dest;
  
  psVar2 = (spv_diagnostic)operator_new(0x28);
  sVar3 = strlen(message);
  __dest = (char *)operator_new__(sVar3 + 1);
  psVar2->error = __dest;
  sVar1 = position->column;
  (psVar2->position).line = position->line;
  (psVar2->position).column = sVar1;
  (psVar2->position).index = position->index;
  psVar2->isTextSource = false;
  memset(__dest,0,sVar3 + 1);
  strcpy(__dest,message);
  return psVar2;
}

Assistant:

spv_diagnostic spvDiagnosticCreate(const spv_position position,
                                   const char* message) {
  spv_diagnostic diagnostic = new spv_diagnostic_t;
  if (!diagnostic) return nullptr;
  size_t length = strlen(message) + 1;
  diagnostic->error = new char[length];
  if (!diagnostic->error) {
    delete diagnostic;
    return nullptr;
  }
  diagnostic->position = *position;
  diagnostic->isTextSource = false;
  memset(diagnostic->error, 0, length);
  strcpy(diagnostic->error, message);
  return diagnostic;
}